

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O3

BVHBuildNode * __thiscall
pbrt::BVHAggregate::buildUpperSAH
          (BVHAggregate *this,Allocator alloc,
          vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *treeletRoots,
          int start,int end,atomic<int> *totalNodes)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  float fVar15;
  BVHAggregate *this_00;
  pointer ppBVar16;
  int iVar17;
  undefined4 extraout_var;
  BVHBuildNode *pBVar18;
  BVHBuildNode *pBVar19;
  int *piVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  pointer ppBVar24;
  int iVar25;
  long lVar26;
  Point3<float> *pPVar27;
  Float FVar28;
  BVHBuildNode *pBVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  Float *pFVar33;
  long lVar34;
  pointer ppBVar35;
  long lVar36;
  undefined1 auVar37 [8];
  pointer ppBVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  float fVar56;
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int vb_2;
  int vb_4;
  Float cost [11];
  undefined1 local_1a0 [8];
  undefined8 local_198;
  BVHAggregate *local_190;
  BVHSplitBucket buckets [12];
  float fVar57;
  
  cost[0] = (Float)end;
  buckets[0].count = start;
  if (end <= start) {
    LogFatal<char_const(&)[6],char_const(&)[4],char_const(&)[6],int&,char_const(&)[4],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
               ,0x27c,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [6])"start",
               (char (*) [4])0x568432,(char (*) [6])"start",&buckets[0].count,(char (*) [4])0x568432
               ,(int *)cost);
  }
  if (end - start == 1) {
    auVar37 = (undefined1  [8])
              (treeletRoots->
              super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>).
              _M_impl.super__Vector_impl_data._M_start[start];
  }
  else {
    LOCK();
    (totalNodes->super___atomic_base<int>)._M_i = (totalNodes->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    local_190 = this;
    iVar17 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x38,8);
    this_00 = local_190;
    pBVar18 = (BVHBuildNode *)CONCAT44(extraout_var,iVar17);
    auVar51._8_4_ = 0xff7fffff;
    auVar51._0_8_ = 0xff7fffffff7fffff;
    auVar51._12_4_ = 0xff7fffff;
    auVar43._8_4_ = 0x7f7fffff;
    auVar43._0_8_ = 0x7f7fffff7f7fffff;
    auVar43._12_4_ = 0x7f7fffff;
    auVar53 = ZEXT464(0x7f7fffff);
    auVar55 = ZEXT464(0xff7fffff);
    lVar26 = (long)start;
    lVar36 = (long)end;
    pBVar18->children[0] = (BVHBuildNode *)0x0;
    pBVar18->children[1] = (BVHBuildNode *)0x0;
    pBVar18->splitAxis = 0;
    pBVar18->firstPrimOffset = 0;
    *(undefined8 *)&pBVar18->nPrimitives = 0;
    (pBVar18->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
    (pBVar18->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
    *(undefined8 *)&(pBVar18->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = 0xff7fffff7f7fffff;
    uVar8 = vmovlps_avx(auVar51);
    (pBVar18->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar8;
    (pBVar18->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)((ulong)uVar8 >> 0x20);
    do {
      pBVar19 = (treeletRoots->
                super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar26];
      lVar26 = lVar26 + 1;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *(ulong *)&(pBVar19->bounds).pMin.super_Tuple3<pbrt::Point3,_float>;
      uVar2 = (pBVar19->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
      uVar9 = (pBVar19->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      auVar40._4_4_ = uVar9;
      auVar40._0_4_ = uVar2;
      auVar40._8_8_ = 0;
      auVar52 = vminss_avx(ZEXT416((uint)(pBVar19->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z)
                           ,auVar53._0_16_);
      auVar53 = ZEXT1664(auVar52);
      auVar43 = vminps_avx(auVar42,auVar43);
      auVar51 = vmaxps_avx(auVar40,auVar51);
      auVar42 = vmaxss_avx(ZEXT416((uint)(pBVar19->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z)
                           ,auVar55._0_16_);
      auVar55 = ZEXT1664(auVar42);
    } while (lVar36 != lVar26);
    auVar39._8_4_ = 0xff7fffff;
    auVar39._0_8_ = 0xff7fffffff7fffff;
    auVar39._12_4_ = 0xff7fffff;
    auVar41._8_4_ = 0x7f7fffff;
    auVar41._0_8_ = 0x7f7fffff7f7fffff;
    auVar41._12_4_ = 0x7f7fffff;
    auVar40 = ZEXT816(0xff7fffff7f7fffff);
    lVar26 = (long)start;
    do {
      pBVar19 = (treeletRoots->
                super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar26];
      lVar26 = lVar26 + 1;
      uVar3 = (pBVar19->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      uVar10 = (pBVar19->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
      auVar46 = ZEXT416((uint)(((pBVar19->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x +
                               (pBVar19->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x) * 0.5));
      auVar44 = vmaxss_avx(auVar46,auVar39);
      auVar59 = vminss_avx(auVar46,auVar41);
      uVar4 = (pBVar19->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
      uVar11 = (pBVar19->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
      auVar39 = vpermt2ps_avx512vl(auVar39,_DAT_00551cc0,auVar40);
      auVar46._0_4_ = ((float)uVar3 + (float)uVar4) * 0.5;
      auVar46._4_4_ = ((float)uVar10 + (float)uVar11) * 0.5;
      auVar46._8_8_ = 0;
      auVar41 = vmovshdup_avx(auVar41);
      auVar40 = vinsertps_avx(auVar41,auVar40,0x1c);
      auVar45 = vminps_avx(auVar46,auVar40);
      auVar46 = vmaxps_avx(auVar46,auVar39);
      auVar41 = vinsertps_avx(auVar59,auVar45,0x1c);
      auVar39 = vinsertps_avx(auVar44,auVar46,0x1c);
      auVar40 = vinsertps_avx(auVar46,auVar45,0x4c);
    } while (lVar36 != lVar26);
    auVar39 = vsubps_avx(auVar46,auVar45);
    fVar47 = auVar59._0_4_;
    fVar15 = auVar44._0_4_ - fVar47;
    auVar40 = vmovshdup_avx(auVar45);
    auVar41 = vmovshdup_avx(auVar39);
    uVar22 = vcmpps_avx512vl(auVar39,ZEXT416((uint)fVar15),1);
    fVar48 = auVar39._0_4_;
    fVar49 = auVar41._0_4_;
    uVar23 = vcmpps_avx512vl(auVar41,ZEXT416((uint)fVar15),1);
    iVar17 = 0;
    if ((uVar22 & uVar23 & 1) == 0) {
      iVar17 = (fVar48 <= fVar49) + 1;
    }
    fVar56 = auVar45._0_4_;
    fVar57 = auVar40._0_4_;
    if (iVar17 == 1) {
      buckets[0].count = auVar46._0_4_;
      cost[0] = fVar56;
    }
    else if (iVar17 == 0) {
      buckets[0].count = (int)auVar44._0_4_;
      cost[0] = fVar47;
      auVar46 = auVar44;
    }
    else {
      auVar46 = vmovshdup_avx(auVar46);
      buckets[0].count = auVar46._0_4_;
      cost[0] = fVar57;
    }
    if ((auVar46._0_4_ == cost[0]) && (!NAN(auVar46._0_4_) && !NAN(cost[0]))) {
      LogFatal<char_const(&)[25],char_const(&)[25],char_const(&)[25],float&,char_const(&)[25],float&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                 ,0x292,"Check failed: %s != %s with %s = %s, %s = %s",
                 (char (*) [25])"centroidBounds.pMax[dim]",(char (*) [25])"centroidBounds.pMin[dim]"
                 ,(char (*) [25])"centroidBounds.pMax[dim]",(float *)buckets,
                 (char (*) [25])"centroidBounds.pMin[dim]",cost);
    }
    auVar53 = vpmovsxwd_avx512f(_DAT_0056d4e0);
    auVar55 = vbroadcastss_avx512f(ZEXT416(0x7f7fffff));
    lVar26 = (long)start;
    vpscatterdd_avx512f(ZEXT864(buckets) + auVar53,0xfff,ZEXT1664(ZEXT816(0) << 0x40));
    vscatterdps_avx512f(ZEXT864(buckets) + ZEXT864(4) + auVar53,0xfff,auVar55);
    vscatterdps_avx512f(ZEXT864(buckets) + _DAT_0056cdc0,0xfff,auVar55);
    auVar53 = vbroadcastss_avx512f(ZEXT416(0xff7fffff));
    vscatterdps_avx512f(ZEXT864(buckets) + _DAT_0056ce00,0xfff,auVar55);
    vscatterdps_avx512f(ZEXT864(buckets) + _DAT_0056ce40,0xfff,auVar53);
    vscatterdps_avx512f(ZEXT864(buckets) + _DAT_0056ce80,0xfff,auVar53);
    vscatterdps_avx512f(ZEXT864(buckets) + _DAT_0056cec0,0xfff,auVar53);
    ppBVar38 = (treeletRoots->
               super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pBVar19 = ppBVar38[lVar26];
      if (iVar17 == 1) {
        pBVar29 = (BVHBuildNode *)&(pBVar19->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
        pPVar27 = (Point3<float> *)&(pBVar19->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        fVar50 = fVar56;
        fVar58 = fVar48;
      }
      else if (iVar17 == 0) {
        pPVar27 = &(pBVar19->bounds).pMax;
        pBVar29 = pBVar19;
        fVar50 = fVar47;
        fVar58 = fVar15;
      }
      else {
        pBVar29 = (BVHBuildNode *)&(pBVar19->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
        pPVar27 = (Point3<float> *)&(pBVar19->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
        fVar50 = fVar57;
        fVar58 = fVar49;
      }
      FVar28 = (Float)(int)(((((pBVar29->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x +
                              (pPVar27->super_Tuple3<pbrt::Point3,_float>).x) * 0.5 - fVar50) /
                            fVar58) * 12.0);
      cost[0] = 1.54143e-44;
      if (FVar28 != 1.68156e-44) {
        cost[0] = FVar28;
      }
      vb_2 = 0;
      if ((int)cost[0] < 0) {
        piVar20 = &vb_2;
        pFVar33 = cost;
        iVar17 = 0x2a5;
        goto LAB_003cb53c;
      }
      vb_2 = 0xc;
      if (0xb < (uint)cost[0]) {
        piVar20 = &vb_2;
        pFVar33 = cost;
        iVar17 = 0x2a6;
        goto LAB_003cb4fd;
      }
      lVar26 = lVar26 + 1;
      buckets[(uint)cost[0]].count = buckets[(uint)cost[0]].count + 1;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(ulong *)&(pBVar19->bounds).pMin.super_Tuple3<pbrt::Point3,_float>;
      uVar5 = buckets[(uint)cost[0]].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
      uVar12 = buckets[(uint)cost[0]].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
      auVar45._4_4_ = uVar12;
      auVar45._0_4_ = uVar5;
      auVar45._8_8_ = 0;
      uVar6 = (pBVar19->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
      uVar13 = (pBVar19->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      auVar60._4_4_ = uVar13;
      auVar60._0_4_ = uVar6;
      auVar60._8_8_ = 0;
      auVar46 = vminss_avx(ZEXT416((uint)(pBVar19->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z)
                           ,ZEXT416((uint)buckets[(uint)cost[0]].bounds.pMin.
                                          super_Tuple3<pbrt::Point3,_float>.z));
      auVar39 = vminps_avx(auVar44,auVar45);
      uVar7 = buckets[(uint)cost[0]].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
      uVar14 = buckets[(uint)cost[0]].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
      auVar59._4_4_ = uVar14;
      auVar59._0_4_ = uVar7;
      auVar59._8_8_ = 0;
      auVar40 = vmaxps_avx(auVar60,auVar59);
      auVar41 = vmaxss_avx(ZEXT416((uint)(pBVar19->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z)
                           ,ZEXT416((uint)buckets[(uint)cost[0]].bounds.pMax.
                                          super_Tuple3<pbrt::Point3,_float>.z));
      uVar8 = vmovlps_avx(auVar39);
      buckets[(uint)cost[0]].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar8;
      buckets[(uint)cost[0]].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar8 >> 0x20);
      buckets[(uint)cost[0]].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar46._0_4_;
      uVar8 = vmovlps_avx(auVar40);
      buckets[(uint)cost[0]].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar8;
      buckets[(uint)cost[0]].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar8 >> 0x20);
      buckets[(uint)cost[0]].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar41._0_4_;
    } while (lVar36 != lVar26);
    auVar43 = vsubps_avx(auVar51,auVar43);
    fVar50 = auVar42._0_4_ - auVar52._0_4_;
    lVar21 = 0x1c;
    lVar34 = 0x34;
    auVar51 = vmovshdup_avx(auVar43);
    auVar43 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * fVar50)),auVar51,auVar43);
    auVar51 = vfmadd231ss_fma(auVar43,auVar51,ZEXT416((uint)fVar50));
    auVar52._8_4_ = 0x7f7fffff;
    auVar52._0_8_ = 0x7f7fffff7f7fffff;
    auVar52._12_4_ = 0x7f7fffff;
    auVar54._8_4_ = 0xff7fffff;
    auVar54._0_8_ = 0xff7fffffff7fffff;
    auVar54._12_4_ = 0xff7fffff;
    lVar26 = 0;
    do {
      lVar30 = 0;
      iVar25 = 0;
      auVar46 = SUB6416(ZEXT464(0xff7fffff),0);
      auVar39 = SUB6416(ZEXT464(0x7f7fffff),0);
      auVar43 = auVar46;
      auVar42 = auVar54;
      auVar40 = auVar39;
      auVar41 = auVar52;
      do {
        iVar25 = iVar25 + *(int *)((long)&buckets[0].count + lVar30);
        auVar40 = vminss_avx512f(ZEXT416(*(uint *)((long)&buckets[0].bounds.pMin.
                                                          super_Tuple3<pbrt::Point3,_float>.z +
                                                  lVar30)),auVar40);
        puVar1 = (uint *)((long)&buckets[0].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z + lVar30
                         );
        auVar61._8_8_ = 0;
        auVar61._0_8_ =
             *(ulong *)((long)&buckets[0].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x + lVar30);
        auVar41 = vminps_avx512vl(auVar61,auVar41);
        auVar62._8_8_ = 0;
        auVar62._0_8_ =
             *(ulong *)((long)&buckets[0].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x + lVar30);
        auVar42 = vmaxps_avx512vl(auVar62,auVar42);
        lVar30 = lVar30 + 0x1c;
        auVar43 = vmaxss_avx512f(ZEXT416(*puVar1),auVar43);
      } while (lVar21 != lVar30);
      lVar30 = lVar26 + 1;
      iVar31 = 0;
      lVar32 = lVar34;
      auVar44 = auVar52;
      auVar45 = auVar54;
      do {
        iVar31 = iVar31 + *(int *)(local_1a0 + lVar32);
        auVar39 = vminss_avx512f(ZEXT416(*(uint *)((long)&local_198 + lVar32 + 4)),auVar39);
        puVar1 = (uint *)((long)&buckets[0].count + lVar32);
        auVar63._8_8_ = 0;
        auVar63._0_8_ = *(ulong *)(local_1a0 + lVar32 + 4);
        auVar44 = vminps_avx512vl(auVar63,auVar44);
        auVar64._8_8_ = 0;
        auVar64._0_8_ =
             *(ulong *)((long)&buckets[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y + lVar32)
        ;
        auVar45 = vmaxps_avx512vl(auVar64,auVar45);
        lVar32 = lVar32 + 0x1c;
        auVar46 = vmaxss_avx512f(ZEXT416(*puVar1),auVar46);
      } while (lVar32 != 0x168);
      auVar42 = vsubps_avx512vl(auVar42,auVar41);
      auVar40 = vsubss_avx512f(auVar43,auVar40);
      auVar41 = vsubss_avx512f(auVar46,auVar39);
      auVar43 = vcvtsi2ss_avx512f(SUB6416(ZEXT464(0x3f000000),0),iVar25);
      lVar21 = lVar21 + 0x1c;
      lVar34 = lVar34 + 0x1c;
      auVar39 = vmulss_avx512f(auVar42,auVar40);
      auVar46 = vmovshdup_avx512vl(auVar42);
      auVar42 = vfmadd231ss_avx512f(auVar39,auVar46,auVar42);
      auVar42 = vfmadd231ss_avx512f(auVar42,auVar46,auVar40);
      auVar42 = vaddss_avx512f(auVar42,auVar42);
      auVar40 = vsubps_avx512vl(auVar45,auVar44);
      auVar39 = vmulss_avx512f(auVar41,auVar40);
      auVar46 = vmovshdup_avx512vl(auVar40);
      auVar40 = vfmadd231ss_avx512f(auVar39,auVar46,auVar40);
      auVar40 = vfmadd231ss_avx512f(auVar40,auVar46,auVar41);
      auVar40 = vaddss_avx512f(auVar40,auVar40);
      auVar40 = vmulss_avx512f(auVar40,ZEXT416((uint)(float)iVar31));
      auVar43 = vfmadd231ss_avx512f(auVar40,auVar43,auVar42);
      cost[lVar26] = auVar43._0_4_ / (auVar51._0_4_ + auVar51._0_4_) + 0.125;
      lVar26 = lVar30;
    } while (lVar30 != 0xb);
    auVar53 = ZEXT464((uint)cost[0]);
    uVar23 = 1;
    uVar22 = 0;
    do {
      fVar50 = auVar53._0_4_;
      auVar51 = vminss_avx(ZEXT416((uint)cost[uVar23]),auVar53._0_16_);
      auVar53 = ZEXT1664(auVar51);
      if (cost[uVar23] < fVar50) {
        uVar22 = uVar23 & 0xffffffff;
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != 0xb);
    ppBVar35 = (treeletRoots->
               super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    ppBVar38 = ppBVar35 + start;
    local_1a0 = (undefined1  [8])pBVar18;
    local_198 = totalNodes;
    if ((long)start * 8 != lVar36 * 8) {
      ppBVar35 = ppBVar35 + lVar36;
      ppBVar16 = ppBVar38;
LAB_003cb241:
      do {
        ppBVar24 = ppBVar16;
        pBVar18 = *ppBVar24;
        if (iVar17 == 0) {
          lVar26 = 0xc;
          pBVar19 = pBVar18;
          fVar50 = fVar47;
          fVar58 = fVar15;
        }
        else if (iVar17 == 1) {
          lVar26 = 0x10;
          pBVar19 = (BVHBuildNode *)&(pBVar18->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
          fVar50 = fVar56;
          fVar58 = fVar48;
        }
        else {
          lVar26 = 0x14;
          pBVar19 = (BVHBuildNode *)&(pBVar18->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
          fVar50 = fVar57;
          fVar58 = fVar49;
        }
        vb_2 = (int)(((((pBVar19->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x +
                       *(float *)((long)pBVar18->children + lVar26 + -0x18)) * 0.5 - fVar50) /
                     fVar58) * 12.0);
        if (vb_2 == 0xc) {
          vb_2 = 0xb;
        }
        if (vb_2 < 0) {
LAB_003cb50c:
          vb_4 = 0;
          piVar20 = &vb_4;
          pFVar33 = (Float *)&vb_2;
          iVar17 = 0x2ce;
LAB_003cb53c:
          LogFatal<char_const(&)[2],char_const(&)[2],char_const(&)[2],int&,char_const(&)[2],int&>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                     ,iVar17,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [2])0x5590ec,
                     (char (*) [2])0x56f16e,(char (*) [2])0x5590ec,(int *)pFVar33,
                     (char (*) [2])0x56f16e,piVar20);
        }
        if (0xb < (uint)vb_2) {
LAB_003cb4cd:
          vb_4 = 0xc;
          piVar20 = &vb_4;
          pFVar33 = (Float *)&vb_2;
          iVar17 = 0x2cf;
LAB_003cb4fd:
          LogFatal<char_const(&)[2],char_const(&)[9],char_const(&)[2],int&,char_const(&)[9],int&>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                     ,iVar17,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [2])0x5590ec,
                     (char (*) [9])"nBuckets",(char (*) [2])0x5590ec,(int *)pFVar33,
                     (char (*) [9])"nBuckets",piVar20);
        }
        if (vb_2 <= (int)uVar22) {
          ppBVar16 = ppBVar24 + 1;
          ppBVar38 = ppBVar35;
          if (ppBVar24 + 1 == ppBVar35) goto LAB_003cb3c5;
          goto LAB_003cb241;
        }
        do {
          ppBVar35 = ppBVar35 + -1;
          ppBVar38 = ppBVar24;
          if (ppBVar35 == ppBVar24) goto LAB_003cb3c5;
          pBVar19 = *ppBVar35;
          if (iVar17 == 0) {
            lVar26 = 0xc;
            pBVar29 = pBVar19;
            fVar50 = fVar47;
            fVar58 = fVar15;
          }
          else if (iVar17 == 1) {
            lVar26 = 0x10;
            pBVar29 = (BVHBuildNode *)&(pBVar19->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            fVar50 = fVar56;
            fVar58 = fVar48;
          }
          else {
            lVar26 = 0x14;
            pBVar29 = (BVHBuildNode *)&(pBVar19->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar50 = fVar57;
            fVar58 = fVar49;
          }
          vb_2 = (int)(((((pBVar29->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x +
                         *(float *)((long)pBVar19->children + lVar26 + -0x18)) * 0.5 - fVar50) /
                       fVar58) * 12.0);
          if (vb_2 == 0xc) {
            vb_2 = 0xb;
          }
          if (vb_2 < 0) goto LAB_003cb50c;
          if (0xb < (uint)vb_2) goto LAB_003cb4cd;
        } while ((int)uVar22 < vb_2);
        *ppBVar24 = pBVar19;
        *ppBVar35 = pBVar18;
        ppBVar16 = ppBVar24 + 1;
      } while (ppBVar35 != ppBVar24 + 1);
      ppBVar38 = ppBVar24 + 1;
    }
LAB_003cb3c5:
    iVar25 = (int)((ulong)((long)ppBVar38 -
                          (long)(treeletRoots->
                                super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3);
    vb_2 = iVar25;
    if (iVar25 <= start) {
      vb_4 = start;
      LogFatal<char_const(&)[4],char_const(&)[6],char_const(&)[4],int&,char_const(&)[6],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                 ,0x2d3,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [4])"mid",
                 (char (*) [6])"start",(char (*) [4])"mid",&vb_2,(char (*) [6])"start",&vb_4);
    }
    vb_4 = end;
    if (end <= iVar25) {
      LogFatal<char_const(&)[4],char_const(&)[4],char_const(&)[4],int&,char_const(&)[4],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                 ,0x2d4,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [4])"mid",
                 (char (*) [4])0x568432,(char (*) [4])"mid",&vb_2,(char (*) [4])0x568432,&vb_4);
    }
    pBVar18 = buildUpperSAH(local_190,alloc,treeletRoots,start,iVar25,totalNodes);
    pBVar19 = buildUpperSAH(this_00,alloc,treeletRoots,iVar25,end,totalNodes);
    auVar37 = local_1a0;
    BVHBuildNode::InitInterior((BVHBuildNode *)local_1a0,iVar17,pBVar18,pBVar19);
  }
  return (BVHBuildNode *)auVar37;
}

Assistant:

BVHBuildNode *BVHAggregate::buildUpperSAH(Allocator alloc,
                                          std::vector<BVHBuildNode *> &treeletRoots,
                                          int start, int end,
                                          std::atomic<int> *totalNodes) const {
    CHECK_LT(start, end);
    int nNodes = end - start;
    if (nNodes == 1)
        return treeletRoots[start];
    (*totalNodes)++;
    BVHBuildNode *node = alloc.new_object<BVHBuildNode>();

    // Compute bounds of all nodes under this HLBVH node
    Bounds3f bounds;
    for (int i = start; i < end; ++i)
        bounds = Union(bounds, treeletRoots[i]->bounds);

    // Compute bound of HLBVH node centroids, choose split dimension _dim_
    Bounds3f centroidBounds;
    for (int i = start; i < end; ++i) {
        Point3f centroid =
            (treeletRoots[i]->bounds.pMin + treeletRoots[i]->bounds.pMax) * 0.5f;
        centroidBounds = Union(centroidBounds, centroid);
    }
    int dim = centroidBounds.MaxDimension();
    // FIXME: if this hits, what do we need to do?
    // Make sure the SAH split below does something... ?
    CHECK_NE(centroidBounds.pMax[dim], centroidBounds.pMin[dim]);

    // Allocate _BVHSplitBucket_ for SAH partition buckets
    constexpr int nBuckets = 12;
    struct BVHSplitBucket {
        int count = 0;
        Bounds3f bounds;
    };
    BVHSplitBucket buckets[nBuckets];

    // Initialize _BVHSplitBucket_ for HLBVH SAH partition buckets
    for (int i = start; i < end; ++i) {
        Float centroid =
            (treeletRoots[i]->bounds.pMin[dim] + treeletRoots[i]->bounds.pMax[dim]) *
            0.5f;
        int b = nBuckets * ((centroid - centroidBounds.pMin[dim]) /
                            (centroidBounds.pMax[dim] - centroidBounds.pMin[dim]));
        if (b == nBuckets)
            b = nBuckets - 1;
        CHECK_GE(b, 0);
        CHECK_LT(b, nBuckets);
        buckets[b].count++;
        buckets[b].bounds = Union(buckets[b].bounds, treeletRoots[i]->bounds);
    }

    // Compute costs for splitting after each bucket
    Float cost[nBuckets - 1];
    for (int i = 0; i < nBuckets - 1; ++i) {
        Bounds3f b0, b1;
        int count0 = 0, count1 = 0;
        for (int j = 0; j <= i; ++j) {
            b0 = Union(b0, buckets[j].bounds);
            count0 += buckets[j].count;
        }
        for (int j = i + 1; j < nBuckets; ++j) {
            b1 = Union(b1, buckets[j].bounds);
            count1 += buckets[j].count;
        }
        cost[i] = .125f + (count0 * b0.SurfaceArea() + count1 * b1.SurfaceArea()) /
                              bounds.SurfaceArea();
    }

    // Find bucket to split at that minimizes SAH metric
    Float minCost = cost[0];
    int minCostSplitBucket = 0;
    for (int i = 1; i < nBuckets - 1; ++i) {
        if (cost[i] < minCost) {
            minCost = cost[i];
            minCostSplitBucket = i;
        }
    }

    // Split nodes and create interior HLBVH SAH node
    BVHBuildNode **pmid = std::partition(
        &treeletRoots[start], &treeletRoots[end - 1] + 1, [=](const BVHBuildNode *node) {
            Float centroid = (node->bounds.pMin[dim] + node->bounds.pMax[dim]) * 0.5f;
            int b = nBuckets * ((centroid - centroidBounds.pMin[dim]) /
                                (centroidBounds.pMax[dim] - centroidBounds.pMin[dim]));
            if (b == nBuckets)
                b = nBuckets - 1;
            CHECK_GE(b, 0);
            CHECK_LT(b, nBuckets);
            return b <= minCostSplitBucket;
        });
    int mid = pmid - &treeletRoots[0];
    CHECK_GT(mid, start);
    CHECK_LT(mid, end);
    node->InitInterior(dim,
                       this->buildUpperSAH(alloc, treeletRoots, start, mid, totalNodes),
                       this->buildUpperSAH(alloc, treeletRoots, mid, end, totalNodes));
    return node;
}